

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plurrule.cpp
# Opt level: O0

void __thiscall icu_63::FixedDecimal::FixedDecimal(FixedDecimal *this,double n,int32_t v,int64_t f)

{
  int64_t f_local;
  int32_t v_local;
  double n_local;
  FixedDecimal *this_local;
  
  IFixedDecimal::IFixedDecimal(&this->super_IFixedDecimal);
  UObject::UObject(&this->super_UObject);
  (this->super_IFixedDecimal)._vptr_IFixedDecimal = (_func_int **)&PTR__FixedDecimal_004afbc0;
  (this->super_UObject)._vptr_UObject = (_func_int **)&PTR__FixedDecimal_004afc00;
  init(this,(EVP_PKEY_CTX *)(ulong)(uint)v);
  return;
}

Assistant:

FixedDecimal::FixedDecimal(double n, int32_t v, int64_t f) {
    init(n, v, f);
    // check values. TODO make into unit test.
    //            
    //            long visiblePower = (int) Math.pow(10, v);
    //            if (decimalDigits > visiblePower) {
    //                throw new IllegalArgumentException();
    //            }
    //            double fraction = intValue + (decimalDigits / (double) visiblePower);
    //            if (fraction != source) {
    //                double diff = Math.abs(fraction - source)/(Math.abs(fraction) + Math.abs(source));
    //                if (diff > 0.00000001d) {
    //                    throw new IllegalArgumentException();
    //                }
    //            }
}